

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void duckdb_je_tcache_bin_flush_stashed
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,_Bool is_small)

{
  uint64_t *puVar1;
  bin_t *batcher;
  size_t *psVar2;
  ulong *puVar3;
  char cVar4;
  ushort uVar5;
  undefined2 uVar6;
  uint uVar7;
  arena_t *arena;
  edata_t *peVar8;
  uint64_t uVar9;
  emap_batch_lookup_result_t eVar10;
  void *pvVar11;
  undefined8 uVar12;
  bool bVar13;
  szind_t sVar14;
  ticker_geom_t *ptVar15;
  void **ppvVar16;
  bin_t *pbVar17;
  edata_list_active_t item;
  _Bool _Var18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  size_t sVar22;
  long lVar23;
  bin_t *pbVar24;
  pthread_mutex_t *nflush;
  size_t sVar25;
  undefined8 *puVar26;
  ushort uVar27;
  edata_t *slab;
  ulong uVar28;
  long *plVar29;
  uint uVar30;
  undefined7 in_register_00000081;
  pthread_mutex_t *ppVar31;
  arena_t *paVar32;
  long lVar33;
  uint binind_00;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  uint i_1;
  ulong uVar37;
  bool bVar38;
  long local_228 [32];
  ulong local_128;
  tcache_t *local_120;
  void **local_118;
  long local_110;
  uint32_t *local_108;
  ulong local_100;
  ticker_geom_t *local_f8;
  uint64_t *local_f0;
  ulong local_e8;
  undefined1 *local_e0;
  ulong local_d8;
  cache_bin_ptr_array_t local_d0;
  uint local_c0;
  undefined4 local_bc;
  long local_b8;
  bin_t *local_b0;
  pthread_mutex_t *local_a8;
  ulong local_a0;
  edata_list_active_t local_98;
  edata_list_active_t dalloc_slabs_extra;
  arena_stats_large_t *lstats;
  uint local_34;
  
  ppVar31 = (pthread_mutex_t *)CONCAT71(in_register_00000081,is_small);
  local_bc = SUB84(ppVar31,0);
  uVar5 = (cache_bin->bin_info).ncached_max;
  uVar27 = (uVar5 * 8 - (short)*(int *)&cache_bin->low_bits_empty) + cache_bin->low_bits_full;
  if (7 < uVar27) {
    uVar28 = (ulong)(uVar27 >> 3);
    local_118 = (void **)((long)cache_bin->stack_head +
                         (ulong)uVar5 * -8 +
                         (ulong)(*(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head &
                                0xffff));
    uVar36 = (ulong)binind;
    local_120 = tcache;
    duckdb_je_san_check_stashed_ptrs(local_118,uVar28,duckdb_je_sz_index2size_tab[uVar36]);
    local_f8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
    local_f0 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state;
    local_108 = &duckdb_je_bin_infos[uVar36].nregs;
    local_e8 = 0;
    local_110 = (uVar36 - 0x24) * 0x30;
    local_e0 = (undefined1 *)local_228;
    local_d8 = uVar28;
    local_a0 = uVar36;
    do {
      binind_00 = (int)local_d8 - (int)local_e8;
      if (0xff < binind_00) {
        binind_00 = 0x100;
      }
      uVar36 = (ulong)binind_00;
      local_d0.n = (cache_bin_sz_t)binind_00;
      local_d0.ptr = local_118 + local_e8;
      arena = local_120->tcache_slow->arena;
      if ((char)local_bc == '\0') {
        puVar26 = (undefined8 *)(local_e0 + -(uVar36 * 8 + 0x17 & 0xfffffffffffffff0));
        puVar26[-1] = 0xe76703;
        tcache_bin_flush_edatas_lookup
                  (tsd,&local_d0,binind_00,(size_t)puVar26,(emap_batch_lookup_result_t *)ppVar31);
        lVar21 = local_110;
        bVar13 = false;
        while (iVar35 = (int)uVar36, iVar35 != 0) {
          uVar34 = *(uint *)*puVar26 & 0xfff;
          paVar32 = (arena_t *)duckdb_je_arenas[uVar34].repr;
          if (paVar32 == (arena_t *)0x0) {
            paVar32 = (arena_t *)0x0;
          }
          if (duckdb_je_manual_arena_base <= paVar32->ind) {
            puVar26[-1] = 0xe76773;
            malloc_mutex_lock((tsdn_t *)tsd,&paVar32->large_mtx);
          }
          if ((arena == paVar32) && (!bVar13)) {
            LOCK();
            plVar29 = (long *)((long)&(arena->stats).lstats[0].nrequests.val.repr + lVar21);
            *plVar29 = *plVar29 + (cache_bin->tstats).nrequests;
            UNLOCK();
            LOCK();
            plVar29 = (long *)((long)&(arena->stats).lstats[0].nflushes.val.repr + lVar21);
            *plVar29 = *plVar29 + 1;
            UNLOCK();
            (cache_bin->tstats).nrequests = 0;
            bVar13 = true;
          }
          for (uVar28 = 0; uVar36 != uVar28; uVar28 = uVar28 + 1) {
            peVar8 = (edata_t *)puVar26[uVar28];
            if (((uint)peVar8->e_bits & 0xfff) == uVar34) {
              puVar26[-1] = 0xe767c7;
              duckdb_je_large_dalloc_prep_locked((tsdn_t *)tsd,peVar8);
            }
          }
          if (duckdb_je_manual_arena_base <= paVar32->ind) {
            (paVar32->large_mtx).field_0.field_0.locked.repr = false;
            puVar26[-1] = 0xe76800;
            pthread_mutex_unlock((pthread_mutex_t *)((long)&(paVar32->large_mtx).field_0 + 0x48));
          }
          ppvVar16 = local_d0.ptr;
          uVar28 = 0;
          for (uVar37 = 0; puVar1 = local_f0, ptVar15 = local_f8, uVar36 != uVar37;
              uVar37 = uVar37 + 1) {
            peVar8 = (edata_t *)puVar26[uVar37];
            if (((uint)peVar8->e_bits & 0xfff) == uVar34) {
              puVar26[-1] = 0xe76831;
              duckdb_je_large_dalloc_finish((tsdn_t *)tsd,peVar8);
            }
            else {
              ppvVar16[uVar28] = ppvVar16[uVar37];
              puVar26[uVar28] = peVar8;
              uVar28 = (ulong)((int)uVar28 + 1);
            }
          }
          uVar36 = uVar28;
          if (tsd != (tsd_t *)0x0) {
            cVar4 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
            puVar26[-1] = 0xe76884;
            _Var18 = ticker_geom_ticks(ptVar15,puVar1,iVar35 - (int)uVar28,'\0' < cVar4);
            if (_Var18) {
              puVar26[-1] = 0xe7689c;
              duckdb_je_arena_decay((tsdn_t *)tsd,paVar32,false,false);
            }
          }
        }
        iVar35 = (int)local_e8;
        if (!bVar13) {
          LOCK();
          plVar29 = (long *)((long)&(arena->stats).lstats[0].nrequests.val.repr + lVar21);
          *plVar29 = *plVar29 + (cache_bin->tstats).nrequests;
          UNLOCK();
          LOCK();
          plVar29 = (long *)((long)&(arena->stats).lstats[0].nflushes.val.repr + lVar21);
          *plVar29 = *plVar29 + 1;
          UNLOCK();
          (cache_bin->tstats).nrequests = 0;
        }
      }
      else {
        local_c0 = (uint)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).
                         binshard[local_a0];
        uVar28 = uVar36 * 8 + 0x17 & 0xfffffffffffffff0;
        nflush = (pthread_mutex_t *)(local_e0 + -uVar28);
        local_128 = uVar36;
        local_a8 = nflush;
        ((emap_batch_lookup_result_t *)((long)nflush - 8))->edata = (edata_t *)0xe76156;
        tcache_bin_flush_edatas_lookup
                  (tsd,&local_d0,binind_00,(size_t)nflush,(emap_batch_lookup_result_t *)ppVar31);
        lVar21 = (long)nflush - uVar28;
        local_98.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
        local_34 = 0;
        bVar13 = false;
        uVar34 = 0;
        local_b8 = lVar21;
        while (ppvVar16 = local_d0.ptr, sVar14 = duckdb_je_bin_info_nbatched_sizes,
              uVar34 < binind_00) {
          uVar36 = (ulong)uVar34;
          peVar8 = ((emap_batch_lookup_result_t *)((long)local_a8 + uVar36 * 8))->edata;
          uVar20 = (uint)peVar8->e_bits;
          paVar32 = (arena_t *)duckdb_je_arenas[uVar20 & 0xfff].repr;
          if (paVar32 == (arena_t *)0x0) {
            paVar32 = (arena_t *)0x0;
          }
          uVar19 = (uint)(peVar8->e_bits >> 0x26) & 0x3f;
          uVar7 = duckdb_je_arena_bin_offsets[local_a0];
          dalloc_slabs_extra.head.qlh_first._0_4_ = duckdb_je_bin_info_nbatched_sizes;
          uVar37 = (ulong)(uVar34 + 1);
          for (uVar28 = (ulong)(uVar34 + 1); uVar30 = (uint)uVar37, uVar28 < local_128;
              uVar28 = uVar28 + 1) {
            peVar8 = ((emap_batch_lookup_result_t *)((long)local_a8 + uVar28 * 8))->edata;
            uVar9 = peVar8->e_bits;
            if ((((uVar20 ^ (uint)uVar9) & 0xfff) == 0) &&
               (((uint)(uVar9 >> 0x26) & 0x3f) == uVar19)) {
              eVar10 = *(emap_batch_lookup_result_t *)((long)local_a8 + uVar37 * 8);
              ((emap_batch_lookup_result_t *)((long)local_a8 + uVar37 * 8))->edata = peVar8;
              *(emap_batch_lookup_result_t *)((long)local_a8 + uVar28 * 8) = eVar10;
              pvVar11 = local_d0.ptr[uVar37];
              local_d0.ptr[uVar37] = local_d0.ptr[uVar28];
              local_d0.ptr[uVar28] = pvVar11;
              uVar37 = (ulong)(uVar30 + 1);
            }
          }
          local_b0 = (bin_t *)((long)&paVar32->nthreads[(ulong)uVar19 * 0xa2].repr + (ulong)uVar7);
          pbVar24 = (bin_t *)((long)&paVar32->nthreads[0].repr + (ulong)(uVar19 << 8) + (ulong)uVar7
                             );
          if (binind < sVar14) {
            pbVar24 = local_b0;
          }
          local_100 = (ulong)(uVar30 - uVar34);
          if ((uVar19 == local_c0 && paVar32 == arena || sVar14 <= binind) ||
              duckdb_je_opt_bin_info_remote_free_max_batch < local_100) {
            *(undefined8 *)(lVar21 + -8) = 0xe762db;
            malloc_mutex_lock((tsdn_t *)tsd,&pbVar24->lock);
LAB_00e76386:
            ppVar31 = local_a8;
            ppvVar16 = local_d0.ptr;
            if ((paVar32 == arena) && (!bVar13)) {
              puVar1 = &(pbVar24->stats).nflushes;
              *puVar1 = *puVar1 + 1;
              puVar1 = &(pbVar24->stats).nrequests;
              *puVar1 = *puVar1 + (cache_bin->tstats).nrequests;
              (cache_bin->tstats).nrequests = 0;
              bVar13 = true;
            }
            uVar34 = duckdb_je_arena_binind_div_info[local_a0].magic;
            for (lVar33 = 0; pbVar17 = local_b0, uVar36 + lVar33 < uVar37; lVar33 = lVar33 + 1) {
              peVar8 = *(edata_t **)((long)ppVar31 + lVar33 * 8 + uVar36 * 8);
              uVar28 = ((long)ppvVar16[uVar36 + lVar33] - (long)peVar8->e_addr) * (ulong)uVar34;
              *(undefined8 *)(lVar21 + -8) = 1;
              puVar3 = (ulong *)((long)&peVar8->field_6 + (uVar28 >> 0x26) * 8);
              *puVar3 = *puVar3 ^ *(long *)(lVar21 + -8) << ((byte)(uVar28 >> 0x20) & 0x3f);
              uVar28 = peVar8->e_bits + 0x10000000;
              peVar8->e_bits = uVar28;
              uVar20 = (uint)(uVar28 >> 0x1c) & 0x3ff;
              if (uVar20 == *local_108) {
                *(undefined8 *)(lVar21 + -8) = 0xe7645d;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                          ((tsdn_t *)tsd,paVar32,peVar8,pbVar24);
                if (local_34 < binind_00) {
                  *(edata_t **)(local_b8 + (ulong)local_34 * 8) = peVar8;
                  local_34 = local_34 + 1;
                }
                else {
                  *(undefined8 *)(lVar21 + -8) = 0xe764af;
                  edata_list_active_append(&local_98,peVar8);
                }
              }
              else if ((uVar20 == 1) && (pbVar24->slabcur != peVar8)) {
                *(undefined8 *)(lVar21 + -8) = 0xe76496;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                          ((tsdn_t *)tsd,paVar32,peVar8,pbVar24);
              }
            }
            if (binind < (szind_t)dalloc_slabs_extra.head.qlh_first) {
              batcher = local_b0 + 1;
              *(undefined8 *)(lVar21 + -8) = 0xe764eb;
              sVar22 = duckdb_je_batcher_pop_begin((tsdn_t *)tsd,(batcher_t *)batcher);
              if (sVar22 != 0xffffffffffffffff) {
                *(undefined8 *)(lVar21 + -8) = 0xe76506;
                dalloc_slabs_extra.head.qlh_first =
                     (anon_struct_8_1_803fbc3e_for_head)
                     duckdb_je_batcher_pop_get_pushes((tsdn_t *)tsd,(batcher_t *)batcher);
                lVar23 = 0;
                sVar25 = sVar22;
                while (bVar38 = sVar25 != 0, sVar25 = sVar25 - 1, bVar38) {
                  puVar26 = (undefined8 *)((long)&pbVar17[1].stats.curregs + lVar23);
                  uVar12 = puVar26[1];
                  *(undefined8 *)((long)local_228 + lVar23) = *puVar26;
                  *(undefined8 *)((long)local_228 + lVar23 + 8) = uVar12;
                  lVar23 = lVar23 + 0x10;
                }
                *(undefined8 *)(lVar21 + -8) = 0xe7653c;
                batcher_pop_end((tsdn_t *)tsd,(batcher_t *)batcher);
                plVar29 = local_228 + 1;
                for (lVar23 = 0; -lVar23 != sVar22; lVar23 = lVar23 + -1) {
                  peVar8 = (edata_t *)*plVar29;
                  uVar36 = (plVar29[-1] - (long)peVar8->e_addr) * (ulong)uVar34;
                  *(undefined8 *)(lVar21 + -8) = 1;
                  puVar3 = (ulong *)((long)&peVar8->field_6 + (uVar36 >> 0x26) * 8);
                  *puVar3 = *puVar3 ^ *(long *)(lVar21 + -8) << ((byte)(uVar36 >> 0x20) & 0x3f);
                  uVar36 = peVar8->e_bits + 0x10000000;
                  peVar8->e_bits = uVar36;
                  uVar20 = (uint)(uVar36 >> 0x1c) & 0x3ff;
                  if (uVar20 == *local_108) {
                    *(undefined8 *)(lVar21 + -8) = 0xe765b8;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                              ((tsdn_t *)tsd,paVar32,peVar8,pbVar24);
                    if (local_34 < binind_00) {
                      *(edata_t **)(local_b8 + (ulong)local_34 * 8) = peVar8;
                      local_34 = local_34 + 1;
                    }
                    else {
                      *(undefined8 *)(lVar21 + -8) = 0xe7660a;
                      edata_list_active_append(&local_98,peVar8);
                    }
                  }
                  else if ((uVar20 == 1) && (pbVar24->slabcur != peVar8)) {
                    *(undefined8 *)(lVar21 + -8) = 0xe765f1;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                              ((tsdn_t *)tsd,paVar32,peVar8,pbVar24);
                  }
                  plVar29 = plVar29 + 2;
                }
                puVar1 = &(pbVar24->stats).batch_pops;
                *puVar1 = *puVar1 + 1;
                puVar1 = &(pbVar24->stats).batch_pushes;
                *puVar1 = *puVar1 + (long)dalloc_slabs_extra.head.qlh_first;
                puVar1 = &(pbVar24->stats).batch_pushed_elems;
                *puVar1 = *puVar1 + sVar22;
                lVar33 = lVar33 - lVar23;
              }
            }
            puVar1 = &(pbVar24->stats).ndalloc;
            *puVar1 = *puVar1 + lVar33;
            psVar2 = &(pbVar24->stats).curregs;
            *psVar2 = *psVar2 - lVar33;
            (pbVar24->lock).field_0.field_0.locked.repr = false;
            ppVar31 = (pthread_mutex_t *)((long)&(pbVar24->lock).field_0 + 0x48);
            *(undefined8 *)(lVar21 + -8) = 0xe76661;
            pthread_mutex_unlock(ppVar31);
          }
          else {
            *(undefined8 *)(lVar21 + -8) = 0xe762ec;
            _Var18 = malloc_mutex_trylock((tsdn_t *)tsd,&pbVar24->lock);
            uVar28 = local_100;
            if (!_Var18) goto LAB_00e76386;
            *(undefined8 *)(lVar21 + -8) = 0xe76316;
            sVar22 = duckdb_je_batcher_push_begin((tsdn_t *)tsd,(batcher_t *)(pbVar24 + 1),uVar28);
            ppVar31 = local_a8;
            if (sVar22 == 0xffffffffffffffff) {
              *(undefined8 *)(lVar21 + -8) = 0xe7637b;
              malloc_mutex_lock((tsdn_t *)tsd,&pbVar24->lock);
              puVar1 = &(pbVar24->stats).batch_failed_pushes;
              *puVar1 = *puVar1 + 1;
              goto LAB_00e76386;
            }
            for (lVar33 = 0; uVar28 << 4 != lVar33; lVar33 = lVar33 + 0x10) {
              *(void **)((long)&pbVar24[1].stats.curregs + lVar33 + sVar22 * 0x10) =
                   ppvVar16[uVar34];
              *(emap_batch_lookup_result_t *)
               ((long)&pbVar24[1].stats.nfills + lVar33 + sVar22 * 0x10) =
                   *(emap_batch_lookup_result_t *)((long)local_a8 + (ulong)uVar34 * 8);
              uVar34 = uVar34 + 1;
            }
            *(undefined8 *)(lVar21 + -8) = 0xe7636a;
            batcher_push_end((tsdn_t *)tsd,(batcher_t *)(pbVar24 + 1));
          }
          puVar1 = local_f0;
          ptVar15 = local_f8;
          uVar36 = local_100;
          uVar34 = uVar30;
          if (tsd != (tsd_t *)0x0) {
            cVar4 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
            *(undefined8 *)(lVar21 + -8) = 0xe7669e;
            _Var18 = ticker_geom_ticks(ptVar15,puVar1,(int32_t)uVar36,'\0' < cVar4);
            if (_Var18) {
              *(undefined8 *)(lVar21 + -8) = 0xe766be;
              duckdb_je_arena_decay((tsdn_t *)tsd,paVar32,false,false);
            }
          }
        }
        for (uVar36 = 0; local_34 != uVar36; uVar36 = uVar36 + 1) {
          peVar8 = *(edata_t **)(local_b8 + uVar36 * 8);
          paVar32 = (arena_t *)duckdb_je_arenas[(uint)peVar8->e_bits & 0xfff].repr;
          *(undefined8 *)(lVar21 + -8) = 0xe768d6;
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar32,peVar8);
        }
        while (item.head.qlh_first = local_98.head.qlh_first,
              local_98.head.qlh_first != (edata_t *)0x0) {
          *(undefined8 *)(lVar21 + -8) = 0xe768ea;
          edata_list_active_remove(&local_98,(edata_t *)item.head.qlh_first);
          paVar32 = (arena_t *)duckdb_je_arenas[*(uint *)item.head.qlh_first & 0xfff].repr;
          *(undefined8 *)(lVar21 + -8) = 0xe76904;
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar32,(edata_t *)item.head.qlh_first);
        }
        if (!bVar13) {
          *(undefined8 *)(lVar21 + -8) = 0xe7692f;
          pbVar24 = duckdb_je_arena_bin_choose((tsdn_t *)tsd,arena,binind,(uint *)0x0);
          *(undefined8 *)(lVar21 + -8) = 0xe7693d;
          malloc_mutex_lock((tsdn_t *)tsd,&pbVar24->lock);
          puVar1 = &(pbVar24->stats).nflushes;
          *puVar1 = *puVar1 + 1;
          puVar1 = &(pbVar24->stats).nrequests;
          *puVar1 = *puVar1 + (cache_bin->tstats).nrequests;
          (cache_bin->tstats).nrequests = 0;
          (pbVar24->lock).field_0.field_0.locked.repr = false;
          *(undefined8 *)(lVar21 + -8) = 0xe76964;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar24->lock).field_0 + 0x48));
        }
        iVar35 = (int)local_e8;
      }
      local_e8 = (ulong)(iVar35 + binind_00);
    } while (iVar35 + binind_00 < (uint)local_d8);
    uVar6 = cache_bin->low_bits_empty;
    cache_bin->low_bits_full = uVar6 + (cache_bin->bin_info).ncached_max * -8;
  }
  return;
}

Assistant:

void
tcache_bin_flush_stashed(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, bool is_small) {
	assert(!tcache_bin_disabled(binind, cache_bin, tcache->tcache_slow));
	/*
	 * The two below are for assertion only.  The content of original cached
	 * items remain unchanged -- the stashed items reside on the other end
	 * of the stack.  Checking the stack head and ncached to verify.
	 */
	void *head_content = *cache_bin->stack_head;
	cache_bin_sz_t orig_cached = cache_bin_ncached_get_local(cache_bin);

	cache_bin_sz_t nstashed = cache_bin_nstashed_get_local(cache_bin);
	assert(orig_cached + nstashed <= cache_bin_ncached_max_get(cache_bin));
	if (nstashed == 0) {
		return;
	}

	CACHE_BIN_PTR_ARRAY_DECLARE(ptrs, nstashed);
	cache_bin_init_ptr_array_for_stashed(cache_bin, binind, &ptrs,
	    nstashed);
	san_check_stashed_ptrs(ptrs.ptr, nstashed, sz_index2size(binind));
	tcache_bin_flush_impl(tsd, tcache, cache_bin, binind, &ptrs, nstashed,
	    is_small);
	cache_bin_finish_flush_stashed(cache_bin);

	assert(cache_bin_nstashed_get_local(cache_bin) == 0);
	assert(cache_bin_ncached_get_local(cache_bin) == orig_cached);
	assert(head_content == *cache_bin->stack_head);
}